

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O3

string * export_section<(pstore::repo::section_kind)0>
                   (string *__return_storage_ptr__,database *db,string_mapping *exported_strings,
                   section_content *content,bool comments)

{
  pointer pcVar1;
  anon_class_24_3_d7a91865 fn;
  string *psVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ostringstream os;
  generic_section *local_c0;
  void *local_b8;
  size_t sStack_b0;
  long local_a8;
  database *local_a0;
  string_mapping *psStack_98;
  uchar local_90;
  uchar auStack_8f [7];
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> local_88;
  ostringstream local_80;
  
  local_88.ptr_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8;
  local_b8 = (void *)0x0;
  sStack_b0 = 0;
  local_a8 = 0;
  pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
  ensure_invariant(&local_88);
  build_section<(pstore::repo::section_kind)0,pstore::repo::generic_section,pstore::repo::generic_section_creation_dispatcher>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,
             (section_content *)local_88.ptr_);
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_80.super_ostream_base,0x1000);
  local_80.str_._M_dataplus._M_p = (pointer)&local_80.str_.field_2;
  local_80.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_80.str_._M_string_length = 0;
  local_80.str_.field_2._M_local_buf[0] = '\0';
  fn._17_1_ = auStack_8f[0];
  fn._18_1_ = auStack_8f[1];
  fn._19_1_ = auStack_8f[2];
  fn._20_1_ = auStack_8f[3];
  fn._21_1_ = auStack_8f[4];
  fn._22_1_ = auStack_8f[5];
  fn._23_1_ = auStack_8f[6];
  fn.comments = comments;
  fn.strings = exported_strings;
  fn.db = db;
  local_a0 = db;
  psStack_98 = exported_strings;
  local_90 = comments;
  pstore::exchange::export_ns::operator()(&local_80,(indent)0x0,local_c0,fn);
  psVar2 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_80);
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string export_section (pstore::database const & db,
                            pstore::exchange::export_ns::string_mapping const & exported_strings,
                            pstore::repo::section_content const & content, bool comments) {
    // First build the section that we want to export.
    std::vector<std::uint8_t> buffer;
    auto const section = build_section<Kind> (&buffer, content);

    // Now export it.
    using namespace pstore::exchange::export_ns;
    ostringstream os;
    emit_section<Kind> (os, indent{}, db, exported_strings, *section, comments);
    return os.str ();
}